

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_resampling_backend_init__linear
                    (void *pUserData,ma_resampler_config *pConfig,void *pHeap,
                    ma_resampling_backend **ppBackend)

{
  long *in_RCX;
  long in_RDI;
  ma_linear_resampler_config linearConfig;
  ma_result result;
  ma_resampler *pResampler;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  ma_resampler_config *in_stack_ffffffffffffffb0;
  undefined4 local_4;
  
  ma_resampling_backend_get_config__linear(in_stack_ffffffffffffffb0);
  local_4 = ma_linear_resampler_init_preallocated(local_68,local_70,local_78);
  if (local_4 == MA_SUCCESS) {
    *in_RCX = in_RDI + 0x28;
    local_4 = MA_SUCCESS;
  }
  return local_4;
}

Assistant:

static ma_result ma_resampling_backend_init__linear(void* pUserData, const ma_resampler_config* pConfig, void* pHeap, ma_resampling_backend** ppBackend)
{
    ma_resampler* pResampler = (ma_resampler*)pUserData;
    ma_result result;
    ma_linear_resampler_config linearConfig;

    (void)pUserData;

    linearConfig = ma_resampling_backend_get_config__linear(pConfig);

    result = ma_linear_resampler_init_preallocated(&linearConfig, pHeap, &pResampler->state.linear);
    if (result != MA_SUCCESS) {
        return result;
    }

    *ppBackend = &pResampler->state.linear;

    return MA_SUCCESS;
}